

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_diag_sse41_128_32.c
# Opt level: O0

parasail_result_t *
parasail_nw_stats_rowcol_diag_sse41_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  undefined8 *puVar12;
  void *pvVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  uint uVar51;
  int iVar52;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  int32_t *ptr_02;
  int32_t *ptr_03;
  int32_t *ptr_04;
  int32_t *ptr_05;
  int32_t *ptr_06;
  int32_t *ptr_07;
  int32_t *ptr_08;
  int iVar53;
  long lVar54;
  int iVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  int iVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  ulong uVar59;
  int iVar64;
  uint uVar65;
  uint uVar66;
  int iVar68;
  int iVar69;
  uint uVar70;
  uint uVar71;
  ulong uVar67;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  __m128i vWH_00;
  __m128i vWH_01;
  __m128i vWH_02;
  __m128i vWH_03;
  int32_t in_stack_ffffffffffffef18;
  int in_stack_ffffffffffffef20;
  int local_10dc;
  int local_10c8;
  int local_10c4;
  int local_10b0;
  int local_10ac;
  int local_1098;
  int local_1094;
  int local_1084;
  int local_1080;
  int32_t value;
  __m128i cond_all;
  __m128i cond_valid_J;
  __m128i cond_valid_I;
  __m128i cond;
  __m128i vNWL;
  __m128i vNWS;
  __m128i vNWM;
  __m128i vNWH;
  __m128i vMat;
  int *matrow3;
  int *matrow2;
  int *matrow1;
  int *matrow0;
  __m128i vs2;
  __m128i vs1;
  __m128i vJ;
  __m128i vFL;
  __m128i vFS;
  __m128i vFM;
  __m128i vF_ext;
  __m128i vF_opn;
  __m128i vF;
  __m128i vEL;
  __m128i vES;
  __m128i vEM;
  __m128i vE_ext;
  __m128i vE_opn;
  __m128i vE;
  __m128i vWL;
  __m128i vWS;
  __m128i vWM;
  __m128i vWH;
  __m128i vNL;
  __m128i vNS;
  __m128i vNM;
  __m128i vNH;
  __m128i case2;
  __m128i case1;
  __m128i vIBoundary;
  __m128i vJLimit1;
  __m128i vJLimit;
  __m128i vILimit1;
  __m128i vILimit;
  __m128i vMaxL;
  __m128i vMaxS;
  __m128i vMaxM;
  __m128i vMaxH;
  __m128i vJreset;
  __m128i vI;
  __m128i vNegOne;
  __m128i vGapN;
  __m128i vN;
  __m128i vOne;
  __m128i vNegInf0;
  __m128i vZero;
  __m128i vGap;
  __m128i vOpen;
  __m128i vNegInf;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  int32_t length;
  int32_t similar;
  int32_t matches;
  int32_t score;
  int32_t POS_LIMIT;
  int32_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int32_t *FL_pr;
  int32_t *FS_pr;
  int32_t *FM_pr;
  int32_t *F_pr;
  int32_t *HL_pr;
  int32_t *HS_pr;
  int32_t *HM_pr;
  int32_t *H_pr;
  int32_t *s2;
  int32_t *_FL_pr;
  int32_t *_FS_pr;
  int32_t *_FM_pr;
  int32_t *_F_pr;
  int32_t *_HL_pr;
  int32_t *_HS_pr;
  int32_t *_HM_pr;
  int32_t *_H_pr;
  int32_t *s2B;
  int32_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *_s2_local;
  int _s1Len_local;
  char *_s1_local;
  int local_948;
  int iStack_944;
  int iStack_940;
  int iStack_93c;
  int local_928;
  int iStack_924;
  int iStack_920;
  int iStack_91c;
  int local_908;
  int local_8e8;
  int iStack_8e4;
  int iStack_8e0;
  int local_8c8;
  int iStack_8c4;
  int iStack_8c0;
  int local_858;
  int iStack_854;
  int iStack_850;
  int iStack_84c;
  int local_838;
  int iStack_834;
  int iStack_830;
  int iStack_82c;
  int local_818;
  int iStack_814;
  int iStack_810;
  int iStack_80c;
  int local_7e8;
  int iStack_7e4;
  int iStack_7e0;
  int iStack_7dc;
  int local_748;
  int iStack_744;
  int iStack_740;
  int iStack_73c;
  int local_328;
  int iStack_324;
  int iStack_320;
  int iStack_31c;
  int local_318;
  int iStack_314;
  int iStack_310;
  int iStack_30c;
  int local_308;
  int iStack_304;
  int iStack_300;
  int iStack_2fc;
  int local_2f8;
  int iStack_2f4;
  int iStack_2f0;
  int iStack_2ec;
  int local_2e8;
  int iStack_2e4;
  int iStack_2e0;
  int iStack_2dc;
  int local_2c8;
  int iStack_2c4;
  int iStack_2c0;
  int iStack_2bc;
  int local_2a8;
  int iStack_2a4;
  int iStack_2a0;
  int iStack_29c;
  int local_288;
  int iStack_284;
  int iStack_280;
  int iStack_27c;
  int local_248;
  int iStack_244;
  int iStack_240;
  int iStack_23c;
  int local_228;
  int iStack_224;
  int iStack_220;
  int iStack_21c;
  int local_218;
  int iStack_214;
  int iStack_210;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  int local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  
  if (_s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_rowcol_diag_sse41_128_32","_s2");
    _s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_rowcol_diag_sse41_128_32","s2Len");
    _s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_rowcol_diag_sse41_128_32","open");
    _s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_rowcol_diag_sse41_128_32","gap");
    _s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_rowcol_diag_sse41_128_32","matrix");
    _s1_local = (char *)0x0;
  }
  else {
    if (matrix->type == 1) {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: stats functions with pssm require a consensus sequence\n",
                "parasail_nw_stats_rowcol_diag_sse41_128_32");
        return (parasail_result_t *)0x0;
      }
    }
    else {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_rowcol_diag_sse41_128_32","_s1");
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_rowcol_diag_sse41_128_32","_s1Len"
               );
        return (parasail_result_t *)0x0;
      }
    }
    local_1080 = _s1Len;
    if (matrix->type != 0) {
      local_1080 = matrix->length;
    }
    NEG_LIMIT = local_1080 + -1;
    POS_LIMIT = s2Len + -1;
    if (-open < matrix->min) {
      local_1084 = open + -0x80000000;
    }
    else {
      local_1084 = -0x80000000 - matrix->min;
    }
    uVar51 = local_1084 + 1;
    iVar52 = 0x7ffffffe - matrix->max;
    vNegInf[1] = CONCAT44(uVar51,uVar51);
    vSaturationCheckMax[0] = CONCAT44(uVar51,uVar51);
    vSaturationCheckMax[1] = CONCAT44(iVar52,iVar52);
    vSaturationCheckMin[0] = CONCAT44(iVar52,iVar52);
    uVar14 = CONCAT44(uVar51,uVar51);
    uVar15 = CONCAT44(uVar51,uVar51);
    vJreset[1] = 0x200000003;
    vI[0] = 1;
    vMaxH[0] = uVar15;
    vMaxM[1] = uVar14;
    vMaxM[0] = uVar15;
    vMaxS[1] = uVar14;
    vMaxS[0] = uVar15;
    vMaxL[1] = uVar14;
    vMaxL[0] = uVar15;
    vILimit[1] = uVar14;
    iVar53 = -open;
    case1[1] = CONCAT44(iVar53 + gap * -2,iVar53 + gap * -3);
    vIBoundary[0] = CONCAT44(iVar53,iVar53 - gap);
    _s1_local = (char *)parasail_result_new_rowcol3(local_1080,s2Len);
    if ((parasail_result_t *)_s1_local == (parasail_result_t *)0x0) {
      _s1_local = (char *)0x0;
    }
    else {
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x4411001;
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x40000;
      ptr = parasail_memalign_int32_t(0x10,(long)(local_1080 + 3));
      ptr_00 = parasail_memalign_int32_t(0x10,(long)(s2Len + 6));
      ptr_01 = parasail_memalign_int32_t(0x10,(long)(s2Len + 6));
      ptr_02 = parasail_memalign_int32_t(0x10,(long)(s2Len + 6));
      ptr_03 = parasail_memalign_int32_t(0x10,(long)(s2Len + 6));
      ptr_04 = parasail_memalign_int32_t(0x10,(long)(s2Len + 6));
      ptr_05 = parasail_memalign_int32_t(0x10,(long)(s2Len + 6));
      ptr_06 = parasail_memalign_int32_t(0x10,(long)(s2Len + 6));
      ptr_07 = parasail_memalign_int32_t(0x10,(long)(s2Len + 6));
      ptr_08 = parasail_memalign_int32_t(0x10,(long)(s2Len + 6));
      if (ptr == (int32_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_00 == (int32_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_01 == (int32_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_02 == (int32_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_03 == (int32_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_04 == (int32_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_05 == (int32_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_06 == (int32_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_07 == (int32_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_08 == (int32_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else {
        for (end_query = 0; end_query < local_1080; end_query = end_query + 1) {
          ptr[end_query] = matrix->mapper[(byte)_s1[end_query]];
        }
        for (end_query = local_1080; end_query < local_1080 + 3; end_query = end_query + 1) {
          ptr[end_query] = 0;
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 3] = matrix->mapper[(byte)_s2[end_ref]];
        }
        for (end_ref = -3; iVar53 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 3] = 0;
        }
        while (end_ref = iVar53, end_ref < s2Len + 3) {
          ptr_00[(long)end_ref + 3] = 0;
          iVar53 = end_ref + 1;
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          ptr_01[(long)end_ref + 3] = -(end_ref * gap) - open;
          ptr_02[(long)end_ref + 3] = 0;
          ptr_03[(long)end_ref + 3] = 0;
          ptr_04[(long)end_ref + 3] = 0;
          ptr_05[(long)end_ref + 3] = uVar51;
          ptr_06[(long)end_ref + 3] = 0;
          ptr_07[(long)end_ref + 3] = 0;
          ptr_08[(long)end_ref + 3] = 0;
        }
        for (end_ref = -3; iVar53 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr_01[(long)end_ref + 3] = 0;
          ptr_02[(long)end_ref + 3] = 0;
          ptr_03[(long)end_ref + 3] = 0;
          ptr_04[(long)end_ref + 3] = 0;
          ptr_05[(long)end_ref + 3] = 0;
          ptr_06[(long)end_ref + 3] = 0;
          ptr_07[(long)end_ref + 3] = 0;
          ptr_08[(long)end_ref + 3] = 0;
        }
        while (end_ref = iVar53, end_ref < s2Len + 3) {
          ptr_01[(long)end_ref + 3] = 0;
          ptr_02[(long)end_ref + 3] = 0;
          ptr_03[(long)end_ref + 3] = 0;
          ptr_04[(long)end_ref + 3] = 0;
          ptr_05[(long)end_ref + 3] = 0;
          ptr_06[(long)end_ref + 3] = 0;
          ptr_07[(long)end_ref + 3] = 0;
          ptr_08[(long)end_ref + 3] = 0;
          iVar53 = end_ref + 1;
        }
        ptr_01[2] = 0;
        for (end_query = 0; end_query < local_1080; end_query = end_query + 4) {
          stack0xfffffffffffff198 = ZEXT816(0);
          stack0xfffffffffffff188 = ZEXT816(0);
          stack0xfffffffffffff178 = ZEXT816(0);
          stack0xfffffffffffff168 = ZEXT816(0);
          stack0xfffffffffffff148 = ZEXT816(0);
          stack0xfffffffffffff138 = ZEXT816(0);
          stack0xfffffffffffff128 = ZEXT816(0);
          stack0xfffffffffffff118 = ZEXT416(uVar51) << 0x60;
          stack0xfffffffffffff0e8 = ZEXT816(0);
          stack0xfffffffffffff0d8 = ZEXT816(0);
          stack0xfffffffffffff0c8 = ZEXT816(0);
          stack0xfffffffffffff0b8 = ZEXT416(uVar51) << 0x60;
          stack0xfffffffffffff088 = ZEXT816(0);
          stack0xfffffffffffff078 = ZEXT816(0);
          stack0xfffffffffffff068 = ZEXT816(0);
          vJ[0] = 0xffffffff;
          lVar54 = (long)end_query;
          iVar53 = ptr[lVar54];
          iVar1 = ptr[lVar54 + 1];
          iVar2 = ptr[lVar54 + 2];
          iVar3 = ptr[lVar54 + 3];
          vs2[0] = uVar15;
          matrow0 = (int *)uVar14;
          piVar8 = matrix->matrix;
          iVar4 = matrix->size;
          if (matrix->type == 0) {
            local_1094 = ptr[end_query];
          }
          else {
            if (end_query < local_1080) {
              local_1098 = end_query;
            }
            else {
              local_1098 = local_1080 + -1;
            }
            local_1094 = local_1098;
          }
          piVar9 = matrix->matrix;
          iVar5 = matrix->size;
          if (matrix->type == 0) {
            local_10ac = ptr[end_query + 1];
          }
          else {
            if (end_query + 1 < local_1080) {
              local_10b0 = end_query + 1;
            }
            else {
              local_10b0 = local_1080 + -1;
            }
            local_10ac = local_10b0;
          }
          piVar10 = matrix->matrix;
          iVar6 = matrix->size;
          if (matrix->type == 0) {
            local_10c4 = ptr[end_query + 2];
          }
          else {
            if (end_query + 2 < local_1080) {
              local_10c8 = end_query + 2;
            }
            else {
              local_10c8 = local_1080 + -1;
            }
            local_10c4 = local_10c8;
          }
          piVar11 = matrix->matrix;
          iVar7 = matrix->size;
          if (matrix->type == 0) {
            local_10dc = ptr[end_query + 3];
          }
          else if (end_query + 3 < local_1080) {
            in_stack_ffffffffffffef20 = end_query + 3;
            local_10dc = in_stack_ffffffffffffef20;
          }
          else {
            in_stack_ffffffffffffef20 = local_1080 + -1;
            local_10dc = in_stack_ffffffffffffef20;
          }
          vNH[0]._4_4_ = ptr_01[2];
          stack0xfffffffffffff158 = ZEXT416((uint)-(open + end_query * gap)) << 0x60;
          ptr_01[2] = -((end_query + 4) * gap) - open;
          end_ref = 0;
          vs1[1] = -0x100000003;
          while( true ) {
            auVar26 = stack0xfffffffffffff198;
            auVar25 = stack0xfffffffffffff188;
            auVar24 = stack0xfffffffffffff178;
            auVar23 = stack0xfffffffffffff168;
            auVar74 = stack0xfffffffffffff088;
            auVar73 = stack0xfffffffffffff078;
            auVar72 = stack0xfffffffffffff068;
            auVar75 = _matrow0;
            local_248 = (int)vJreset[1];
            iStack_244 = (int)((ulong)vJreset[1] >> 0x20);
            iStack_240 = (int)vI[0];
            iStack_23c = (int)((ulong)vI[0] >> 0x20);
            if (s2Len + 3 <= end_ref) break;
            stack0xfffffffffffff198 = vWM._12_12_;
            vNH[0]._4_4_ = ptr_01[(long)end_ref + 3];
            stack0xfffffffffffff188 = vWS._12_12_;
            vNM[0]._4_4_ = ptr_02[(long)end_ref + 3];
            auVar50 = stack0xfffffffffffff188;
            stack0xfffffffffffff178 = vWL._12_12_;
            vNS[0]._4_4_ = ptr_03[(long)end_ref + 3];
            auVar49 = stack0xfffffffffffff178;
            stack0xfffffffffffff168 = vE._12_12_;
            vNL[0]._4_4_ = ptr_04[(long)end_ref + 3];
            auVar48 = stack0xfffffffffffff168;
            stack0xfffffffffffff088 = vFS._12_12_;
            vFM[0]._4_4_ = ptr_06[(long)end_ref + 3];
            auVar29 = stack0xfffffffffffff088;
            stack0xfffffffffffff078 = vFL._12_12_;
            vFS[0]._4_4_ = ptr_07[(long)end_ref + 3];
            auVar28 = stack0xfffffffffffff078;
            stack0xfffffffffffff068 = vJ._12_12_;
            vFL[0]._4_4_ = ptr_08[(long)end_ref + 3];
            auVar27 = stack0xfffffffffffff068;
            local_8c8 = vWM[1]._4_4_;
            iStack_8c4 = (int)vWM[2];
            iStack_8c0 = vWM[2]._4_4_;
            iVar55 = local_8c8 - open;
            iVar60 = iStack_8c4 - open;
            iVar64 = iStack_8c0 - open;
            iVar68 = ptr_01[(long)end_ref + 3] - open;
            local_8e8 = vF_opn[1]._4_4_;
            iStack_8e4 = (int)vF_opn[2];
            iStack_8e0 = vF_opn[2]._4_4_;
            local_8e8 = local_8e8 - gap;
            iStack_8e4 = iStack_8e4 - gap;
            iStack_8e0 = iStack_8e0 - gap;
            iVar69 = ptr_05[(long)end_ref + 3] - gap;
            uVar56 = (uint)(iVar55 < local_8e8) * local_8e8 | (uint)(iVar55 >= local_8e8) * iVar55;
            uVar61 = (uint)(iVar60 < iStack_8e4) * iStack_8e4 |
                     (uint)(iVar60 >= iStack_8e4) * iVar60;
            vF[0]._0_4_ = (uint)(iVar64 < iStack_8e0) * iStack_8e0 |
                          (uint)(iVar64 >= iStack_8e0) * iVar64;
            vF[0]._4_4_ = (uint)(iVar68 < iVar69) * iVar69 | (uint)(iVar68 >= iVar69) * iVar68;
            vF_opn[1] = CONCAT44(uVar61,uVar56);
            case2[1] = CONCAT44(-(uint)(iStack_8e4 < iVar60),-(uint)(local_8e8 < iVar55));
            case1[0] = CONCAT44(-(uint)(iVar69 < iVar68),-(uint)(iStack_8e0 < iVar64));
            vFS[1] = auVar74._4_8_;
            vFM[0] = auVar29._8_8_;
            vNS[1] = vWS._12_8_;
            vNM[0] = auVar50._8_8_;
            auVar47._8_8_ = vFM[0];
            auVar47._0_8_ = vFS[1];
            auVar46._8_8_ = vNM[0];
            auVar46._0_8_ = vNS[1];
            auVar45._8_8_ = case1[0];
            auVar45._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar47,auVar46,auVar45);
            vFL[1] = auVar73._4_8_;
            vFS[0] = auVar28._8_8_;
            vNL[1] = vWL._12_8_;
            vNS[0] = auVar49._8_8_;
            auVar44._8_8_ = vFS[0];
            auVar44._0_8_ = vFL[1];
            auVar43._8_8_ = vNS[0];
            auVar43._0_8_ = vNL[1];
            auVar42._8_8_ = case1[0];
            auVar42._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar44,auVar43,auVar42);
            vJ[1] = auVar72._4_8_;
            vFL[0] = auVar27._8_8_;
            vWH[1] = vE._12_8_;
            vNL[0] = auVar48._8_8_;
            auVar41._8_8_ = vFL[0];
            auVar41._0_8_ = vJ[1];
            auVar40._8_8_ = vNL[0];
            auVar40._0_8_ = vWH[1];
            auVar39._8_8_ = case1[0];
            auVar39._0_8_ = case2[1];
            auVar72 = pblendvb(auVar41,auVar40,auVar39);
            local_288 = auVar72._0_4_;
            iStack_284 = auVar72._4_4_;
            iStack_280 = auVar72._8_4_;
            iStack_27c = auVar72._12_4_;
            vJ[1] = CONCAT44(iStack_284 + 1,local_288 + 1);
            vFL[0]._0_4_ = iStack_280 + 1;
            vFL[0]._4_4_ = iStack_27c + 1;
            local_908 = (int)vWM[1];
            local_908 = local_908 - open;
            local_8c8 = local_8c8 - open;
            iStack_8c4 = iStack_8c4 - open;
            iStack_8c0 = iStack_8c0 - open;
            local_928 = (int)vE_opn[1];
            iStack_924 = vE_opn[1]._4_4_;
            iStack_920 = (int)vE_opn[2];
            iStack_91c = vE_opn[2]._4_4_;
            local_928 = local_928 - gap;
            iStack_924 = iStack_924 - gap;
            iStack_920 = iStack_920 - gap;
            iStack_91c = iStack_91c - gap;
            uVar57 = (uint)(local_908 < local_928) * local_928 |
                     (uint)(local_908 >= local_928) * local_908;
            uVar62 = (uint)(local_8c8 < iStack_924) * iStack_924 |
                     (uint)(local_8c8 >= iStack_924) * local_8c8;
            uVar65 = (uint)(iStack_8c4 < iStack_920) * iStack_920 |
                     (uint)(iStack_8c4 >= iStack_920) * iStack_8c4;
            uVar70 = (uint)(iStack_8c0 < iStack_91c) * iStack_91c |
                     (uint)(iStack_8c0 >= iStack_91c) * iStack_8c0;
            vE_opn[1] = CONCAT44(uVar62,uVar57);
            vE[0]._0_4_ = uVar65;
            vE[0]._4_4_ = uVar70;
            case2[1] = CONCAT44(-(uint)(iStack_924 < local_8c8),-(uint)(local_928 < local_908));
            case1[0] = CONCAT44(-(uint)(iStack_91c < iStack_8c0),-(uint)(iStack_920 < iStack_8c4));
            auVar38._8_8_ = case1[0];
            auVar38._0_8_ = case2[1];
            auVar72 = pblendvb(stack0xfffffffffffff0e8,stack0xfffffffffffff148,auVar38);
            auVar37._8_8_ = case1[0];
            auVar37._0_8_ = case2[1];
            auVar73 = pblendvb(stack0xfffffffffffff0d8,stack0xfffffffffffff138,auVar37);
            auVar36._8_8_ = case1[0];
            auVar36._0_8_ = case2[1];
            auVar74 = pblendvb(stack0xfffffffffffff0c8,stack0xfffffffffffff128,auVar36);
            local_2a8 = auVar74._0_4_;
            iStack_2a4 = auVar74._4_4_;
            iStack_2a0 = auVar74._8_4_;
            iStack_29c = auVar74._12_4_;
            vF[1] = CONCAT44(iStack_2a4 + 1U,local_2a8 + 1U);
            vEL[0]._0_4_ = iStack_2a0 + 1U;
            vEL[0]._4_4_ = iStack_29c + 1U;
            _matrow0 = matrow0._4_12_;
            vs2[0]._4_4_ = ptr_00[(long)end_ref + 3];
            local_2c8 = auVar26._0_4_;
            iStack_2c4 = auVar26._4_4_;
            iStack_2c0 = auVar26._8_4_;
            iStack_2bc = auVar26._12_4_;
            uVar58 = local_2c8 +
                     piVar11[(long)(iVar7 * local_10dc) + (long)ptr_00[(long)(end_ref + -3) + 3]];
            uVar63 = iStack_2c4 +
                     piVar10[(long)(iVar6 * local_10c4) + (long)ptr_00[(long)(end_ref + -2) + 3]];
            uVar66 = iStack_2c0 +
                     piVar9[(long)(iVar5 * local_10ac) + (long)ptr_00[(long)(end_ref + -1) + 3]];
            uVar71 = iStack_2bc +
                     piVar8[(long)(iVar4 * local_1094) + (long)ptr_00[(long)end_ref + 3]];
            uVar57 = ((int)uVar58 < (int)uVar57) * uVar57 | ((int)uVar58 >= (int)uVar57) * uVar58;
            uVar62 = ((int)uVar63 < (int)uVar62) * uVar62 | ((int)uVar63 >= (int)uVar62) * uVar63;
            uVar65 = ((int)uVar66 < (int)uVar65) * uVar65 | ((int)uVar66 >= (int)uVar65) * uVar66;
            uVar70 = ((int)uVar71 < (int)uVar70) * uVar70 | ((int)uVar71 >= (int)uVar70) * uVar71;
            uVar57 = ((int)uVar57 < (int)uVar56) * uVar56 | ((int)uVar57 >= (int)uVar56) * uVar57;
            uVar62 = ((int)uVar62 < (int)uVar61) * uVar61 | ((int)uVar62 >= (int)uVar61) * uVar62;
            uVar65 = ((int)uVar65 < (int)(uint)vF[0]) * (uint)vF[0] |
                     ((int)uVar65 >= (int)(uint)vF[0]) * uVar65;
            uVar70 = ((int)uVar70 < (int)vF[0]._4_4_) * vF[0]._4_4_ |
                     ((int)uVar70 >= (int)vF[0]._4_4_) * uVar70;
            vWM[1] = CONCAT44(uVar62,uVar57);
            vWH[0]._0_4_ = uVar65;
            vWH[0]._4_4_ = uVar70;
            case2[1] = CONCAT44(-(uint)(uVar62 == uVar63),-(uint)(uVar57 == uVar58));
            case1[0] = CONCAT44(-(uint)(uVar70 == uVar71),-(uint)(uVar65 == uVar66));
            vNH[1] = CONCAT44(-(uint)(uVar62 == uVar61),-(uint)(uVar57 == uVar56));
            case2[0] = CONCAT44(-(uint)(uVar70 == vF[0]._4_4_),-(uint)(uVar65 == (uint)vF[0]));
            vES[1] = auVar72._0_8_;
            vEM[0] = auVar72._8_8_;
            auVar35._8_8_ = case2[0];
            auVar35._0_8_ = vNH[1];
            auVar72 = pblendvb(auVar72,register0x00001240,auVar35);
            local_218 = auVar75._4_4_;
            iStack_214 = auVar75._8_4_;
            iStack_210 = auVar75._12_4_;
            uVar59 = CONCAT44(-(uint)(iVar2 == iStack_214),-(uint)(iVar3 == local_218)) &
                     0x100000001;
            uVar67 = CONCAT44(-(uint)(iVar53 == ptr_00[(long)end_ref + 3]),
                              -(uint)(iVar1 == iStack_210)) & 0x100000001;
            local_2e8 = auVar25._0_4_;
            iStack_2e4 = auVar25._4_4_;
            iStack_2e0 = auVar25._8_4_;
            iStack_2dc = auVar25._12_4_;
            local_2f8 = (int)uVar59;
            iStack_2f4 = (int)(uVar59 >> 0x20);
            iStack_2f0 = (int)uVar67;
            iStack_2ec = (int)(uVar67 >> 0x20);
            auVar34._4_4_ = iStack_2e4 + iStack_2f4;
            auVar34._0_4_ = local_2e8 + local_2f8;
            auVar34._8_4_ = iStack_2e0 + iStack_2f0;
            auVar34._12_4_ = iStack_2dc + iStack_2ec;
            auVar33._8_8_ = case1[0];
            auVar33._0_8_ = case2[1];
            auVar75 = pblendvb(auVar72,auVar34,auVar33);
            vEL[1] = auVar73._0_8_;
            vES[0] = auVar73._8_8_;
            auVar32._8_8_ = case2[0];
            auVar32._0_8_ = vNH[1];
            auVar72 = pblendvb(auVar73,register0x00001240,auVar32);
            uVar59 = CONCAT44(-(uint)(0 < piVar10[(long)(iVar6 * local_10c4) +
                                                  (long)ptr_00[(long)(end_ref + -2) + 3]]),
                              -(uint)(0 < piVar11[(long)(iVar7 * local_10dc) +
                                                  (long)ptr_00[(long)(end_ref + -3) + 3]])) &
                     0x100000001;
            uVar67 = CONCAT44(-(uint)(0 < piVar8[(long)(iVar4 * local_1094) +
                                                 (long)ptr_00[(long)end_ref + 3]]),
                              -(uint)(0 < piVar9[(long)(iVar5 * local_10ac) +
                                                 (long)ptr_00[(long)(end_ref + -1) + 3]])) &
                     0x100000001;
            local_308 = auVar24._0_4_;
            iStack_304 = auVar24._4_4_;
            iStack_300 = auVar24._8_4_;
            iStack_2fc = auVar24._12_4_;
            local_318 = (int)uVar59;
            iStack_314 = (int)(uVar59 >> 0x20);
            iStack_310 = (int)uVar67;
            iStack_30c = (int)(uVar67 >> 0x20);
            auVar31._4_4_ = iStack_304 + iStack_314;
            auVar31._0_4_ = local_308 + local_318;
            auVar31._8_4_ = iStack_300 + iStack_310;
            auVar31._12_4_ = iStack_2fc + iStack_30c;
            auVar30._8_8_ = case1[0];
            auVar30._0_8_ = case2[1];
            auVar72 = pblendvb(auVar72,auVar31,auVar30);
            auVar29._8_8_ = vEL[0];
            auVar29._0_8_ = vF[1];
            auVar28._8_8_ = vFL[0];
            auVar28._0_8_ = vJ[1];
            auVar27._8_8_ = case2[0];
            auVar27._0_8_ = vNH[1];
            auVar73 = pblendvb(auVar29,auVar28,auVar27);
            local_328 = auVar23._0_4_;
            iStack_324 = auVar23._4_4_;
            iStack_320 = auVar23._8_4_;
            iStack_31c = auVar23._12_4_;
            auVar26._4_4_ = iStack_324 + 1;
            auVar26._0_4_ = local_328 + 1;
            auVar26._8_4_ = iStack_320 + 1;
            auVar26._12_4_ = iStack_31c + 1;
            auVar25._8_8_ = case1[0];
            auVar25._0_8_ = case2[1];
            auVar73 = pblendvb(auVar73,auVar26,auVar25);
            local_228 = (int)vs1[1];
            iStack_224 = (int)((ulong)vs1[1] >> 0x20);
            iStack_220 = (int)vJ[0];
            iStack_21c = (int)((ulong)vJ[0] >> 0x20);
            uVar57 = -(uint)(local_228 == -1);
            uVar58 = -(uint)(iStack_224 == -1);
            uVar61 = -(uint)(iStack_220 == -1);
            uVar62 = -(uint)(iStack_21c == -1);
            auVar74._4_4_ = uVar58;
            auVar74._0_4_ = uVar57;
            auVar74._12_4_ = uVar62;
            auVar74._8_4_ = uVar61;
            auVar24._8_8_ = vWH[0];
            auVar24._0_8_ = vWM[1];
            auVar23._8_8_ = vIBoundary[0];
            auVar23._0_8_ = case1[1];
            register0x00001240 = pblendvb(auVar24,auVar23,auVar74);
            vWS[1] = auVar75._0_8_;
            vWM[0] = auVar75._8_8_;
            vWS[1] = ~CONCAT44(uVar58,uVar57) & vWS[1];
            vWM[0] = ~CONCAT44(uVar62,uVar61) & vWM[0];
            vWL[1] = auVar72._0_8_;
            vWS[0] = auVar72._8_8_;
            vWL[1] = ~CONCAT44(uVar58,uVar57) & vWL[1];
            vWS[0] = ~CONCAT44(uVar62,uVar61) & vWS[0];
            vE[1] = auVar73._0_8_;
            vWL[0] = auVar73._8_8_;
            vE[1] = ~CONCAT44(uVar58,uVar57) & vE[1];
            vWL[0] = ~CONCAT44(uVar62,uVar61) & vWL[0];
            auVar75._4_4_ = uVar58;
            auVar75._0_4_ = uVar57;
            auVar75._12_4_ = uVar62;
            auVar75._8_4_ = uVar61;
            auVar73._8_8_ = vE[0];
            auVar73._0_8_ = vE_opn[1];
            auVar72._8_8_ = uVar15;
            auVar72._0_8_ = uVar14;
            register0x00001280 = pblendvb(auVar73,auVar72,auVar75);
            vEM[0] = ~CONCAT44(uVar62,uVar61) & vEM[0];
            vES[1] = ~CONCAT44(uVar58,uVar57) & vES[1];
            vES[0] = ~CONCAT44(uVar62,uVar61) & vES[0];
            vEL[1] = ~CONCAT44(uVar58,uVar57) & vEL[1];
            vF[1] = CONCAT44((uVar58 ^ 0xffffffff) & iStack_2a4 + 1U,
                             (uVar57 ^ 0xffffffff) & local_2a8 + 1U);
            vEL[0]._0_4_ = (uVar61 ^ 0xffffffff) & iStack_2a0 + 1U;
            vEL[0]._4_4_ = (uVar62 ^ 0xffffffff) & iStack_29c + 1U;
            local_818 = (int)vWS[1];
            local_838 = (int)vWL[1];
            local_858 = (int)vE[1];
            if (3 < end_ref) {
              local_88 = (int)vSaturationCheckMax[1];
              iStack_84 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
              iStack_80 = (int)vSaturationCheckMin[0];
              iStack_7c = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
              iStack_94 = vWM[1]._4_4_;
              iStack_90 = (int)vWM[2];
              iStack_8c = vWM[2]._4_4_;
              vSaturationCheckMax[1] =
                   CONCAT44((uint)(iStack_94 < iStack_84) * iStack_94 |
                            (uint)(iStack_94 >= iStack_84) * iStack_84,
                            (uint)((int)vWM[1] < local_88) * (int)vWM[1] |
                            (uint)((int)vWM[1] >= local_88) * local_88);
              vSaturationCheckMin[0] =
                   CONCAT44((uint)(iStack_8c < iStack_7c) * iStack_8c |
                            (uint)(iStack_8c >= iStack_7c) * iStack_7c,
                            (uint)(iStack_90 < iStack_80) * iStack_90 |
                            (uint)(iStack_90 >= iStack_80) * iStack_80);
              local_7e8 = (int)vNegInf[1];
              iStack_7e4 = (int)((ulong)vNegInf[1] >> 0x20);
              iStack_7e0 = (int)vSaturationCheckMax[0];
              iStack_7dc = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
              uVar57 = (uint)(local_7e8 < (int)vWM[1]) * (int)vWM[1] |
                       (uint)(local_7e8 >= (int)vWM[1]) * local_7e8;
              uVar58 = (uint)(iStack_7e4 < iStack_94) * iStack_94 |
                       (uint)(iStack_7e4 >= iStack_94) * iStack_7e4;
              uVar61 = (uint)(iStack_7e0 < iStack_90) * iStack_90 |
                       (uint)(iStack_7e0 >= iStack_90) * iStack_7e0;
              uVar62 = (uint)(iStack_7dc < iStack_8c) * iStack_8c |
                       (uint)(iStack_7dc >= iStack_8c) * iStack_7dc;
              iStack_814 = (int)((ulong)vWS[1] >> 0x20);
              iStack_810 = (int)vWM[0];
              iStack_80c = (int)((ulong)vWM[0] >> 0x20);
              uVar57 = (uint)((int)uVar57 < local_818) * local_818 |
                       ((int)uVar57 >= local_818) * uVar57;
              uVar58 = (uint)((int)uVar58 < iStack_814) * iStack_814 |
                       ((int)uVar58 >= iStack_814) * uVar58;
              uVar61 = (uint)((int)uVar61 < iStack_810) * iStack_810 |
                       ((int)uVar61 >= iStack_810) * uVar61;
              uVar62 = (uint)((int)uVar62 < iStack_80c) * iStack_80c |
                       ((int)uVar62 >= iStack_80c) * uVar62;
              iStack_834 = (int)((ulong)vWL[1] >> 0x20);
              iStack_830 = (int)vWS[0];
              iStack_82c = (int)((ulong)vWS[0] >> 0x20);
              uVar57 = (uint)((int)uVar57 < local_838) * local_838 |
                       ((int)uVar57 >= local_838) * uVar57;
              uVar58 = (uint)((int)uVar58 < iStack_834) * iStack_834 |
                       ((int)uVar58 >= iStack_834) * uVar58;
              uVar61 = (uint)((int)uVar61 < iStack_830) * iStack_830 |
                       ((int)uVar61 >= iStack_830) * uVar61;
              uVar62 = (uint)((int)uVar62 < iStack_82c) * iStack_82c |
                       ((int)uVar62 >= iStack_82c) * uVar62;
              iStack_854 = (int)((ulong)vE[1] >> 0x20);
              iStack_850 = (int)vWL[0];
              iStack_84c = (int)((ulong)vWL[0] >> 0x20);
              uVar57 = (uint)((int)uVar57 < local_858) * local_858 |
                       ((int)uVar57 >= local_858) * uVar57;
              uVar58 = (uint)((int)uVar58 < iStack_854) * iStack_854 |
                       ((int)uVar58 >= iStack_854) * uVar58;
              uVar61 = (uint)((int)uVar61 < iStack_850) * iStack_850 |
                       ((int)uVar61 >= iStack_850) * uVar61;
              uVar62 = (uint)((int)uVar62 < iStack_84c) * iStack_84c |
                       ((int)uVar62 >= iStack_84c) * uVar62;
              vNegInf[1] = CONCAT44((uint)((int)uVar58 < iStack_854) * iStack_854 |
                                    ((int)uVar58 >= iStack_854) * uVar58,
                                    (uint)((int)uVar57 < local_858) * local_858 |
                                    ((int)uVar57 >= local_858) * uVar57);
              vSaturationCheckMax[0] =
                   CONCAT44((uint)((int)uVar62 < iStack_84c) * iStack_84c |
                            ((int)uVar62 >= iStack_84c) * uVar62,
                            (uint)((int)uVar61 < iStack_850) * iStack_850 |
                            ((int)uVar61 >= iStack_850) * uVar61);
            }
            puVar12 = (undefined8 *)
                      ((((parasail_result_t *)_s1_local)->field_4).trace)->trace_del_table;
            vWH_00[0] = (ulong)(uint)end_query;
            vWH_00[1]._0_4_ = local_1080;
            vWH_00[1]._4_4_ = 0;
            arr_store_rowcol((int *)*puVar12,(int *)puVar12[4],vWH_00,end_ref,s2Len,
                             in_stack_ffffffffffffef18,in_stack_ffffffffffffef20);
            pvVar13 = ((((parasail_result_t *)_s1_local)->field_4).trace)->trace_del_table;
            vWH_01[0] = (ulong)(uint)end_query;
            vWH_01[1]._0_4_ = local_1080;
            vWH_01[1]._4_4_ = 0;
            arr_store_rowcol(*(int **)((long)pvVar13 + 8),*(int **)((long)pvVar13 + 0x28),vWH_01,
                             end_ref,s2Len,in_stack_ffffffffffffef18,in_stack_ffffffffffffef20);
            pvVar13 = ((((parasail_result_t *)_s1_local)->field_4).trace)->trace_del_table;
            vWH_02[0] = (ulong)(uint)end_query;
            vWH_02[1]._0_4_ = local_1080;
            vWH_02[1]._4_4_ = 0;
            arr_store_rowcol(*(int **)((long)pvVar13 + 0x10),*(int **)((long)pvVar13 + 0x30),vWH_02,
                             end_ref,s2Len,in_stack_ffffffffffffef18,in_stack_ffffffffffffef20);
            pvVar13 = ((((parasail_result_t *)_s1_local)->field_4).trace)->trace_del_table;
            vWH_03[0] = (ulong)(uint)end_query;
            vWH_03[1]._0_4_ = local_1080;
            vWH_03[1]._4_4_ = 0;
            arr_store_rowcol(*(int **)((long)pvVar13 + 0x18),*(int **)((long)pvVar13 + 0x38),vWH_03,
                             end_ref,s2Len,in_stack_ffffffffffffef18,in_stack_ffffffffffffef20);
            ptr_01[(long)(end_ref + -3) + 3] = (int)vWM[1];
            ptr_02[(long)(end_ref + -3) + 3] = local_818;
            ptr_03[(long)(end_ref + -3) + 3] = local_838;
            ptr_04[(long)(end_ref + -3) + 3] = local_858;
            ptr_05[(long)(end_ref + -3) + 3] = uVar56;
            ptr_06[(long)(end_ref + -3) + 3] = (int32_t)vFS[1];
            ptr_07[(long)(end_ref + -3) + 3] = (int32_t)vFL[1];
            ptr_08[(long)(end_ref + -3) + 3] = local_288 + 1;
            uVar59 = CONCAT44(-(uint)(iStack_244 == local_1080 + -1),
                              -(uint)(local_248 == local_1080 + -1)) &
                     CONCAT44(-(uint)(iStack_224 == s2Len + -1),-(uint)(local_228 == s2Len + -1));
            uVar67 = CONCAT44(-(uint)(iStack_23c == local_1080 + -1),
                              -(uint)(iStack_240 == local_1080 + -1)) &
                     CONCAT44(-(uint)(iStack_21c == s2Len + -1),-(uint)(iStack_220 == s2Len + -1));
            auVar22._8_8_ = uVar67;
            auVar22._0_8_ = uVar59;
            register0x00001240 = pblendvb(stack0xfffffffffffff248,register0x00001240,auVar22);
            auVar21._8_8_ = vWM[0];
            auVar21._0_8_ = vWS[1];
            auVar20._8_8_ = uVar67;
            auVar20._0_8_ = uVar59;
            register0x00001240 = pblendvb(stack0xfffffffffffff238,auVar21,auVar20);
            auVar19._8_8_ = vWS[0];
            auVar19._0_8_ = vWL[1];
            auVar18._8_8_ = uVar67;
            auVar18._0_8_ = uVar59;
            register0x00001240 = pblendvb(stack0xfffffffffffff228,auVar19,auVar18);
            auVar17._8_8_ = vWL[0];
            auVar17._0_8_ = vE[1];
            auVar16._8_8_ = uVar67;
            auVar16._0_8_ = uVar59;
            register0x00001240 = pblendvb(stack0xfffffffffffff218,auVar17,auVar16);
            vs1[1] = CONCAT44(iStack_224 + 1,local_228 + 1);
            vJ[0] = CONCAT44(iStack_21c + 1,iStack_220 + 1);
            end_ref = end_ref + 1;
            unique0x1000493b = auVar48;
            unique0x1000495b = auVar49;
            unique0x1000497b = auVar50;
          }
          vJreset[1] = CONCAT44(iStack_244 + 4,local_248 + 4);
          vI[0] = CONCAT44(iStack_23c + 4,iStack_240 + 4);
          local_948 = (int)case1[1];
          iStack_944 = (int)((ulong)case1[1] >> 0x20);
          iStack_940 = (int)vIBoundary[0];
          iStack_93c = (int)((ulong)vIBoundary[0] >> 0x20);
          case1[1] = CONCAT44(iStack_944 + gap * -4,local_948 + gap * -4);
          vIBoundary[0] = CONCAT44(iStack_93c + gap * -4,iStack_940 + gap * -4);
        }
        vNegLimit[1]._0_4_ = uVar51;
        vNegLimit[1]._4_4_ = uVar51;
        length = uVar51;
        similar = uVar51;
        for (end_query = 0; end_query < 4; end_query = end_query + 1) {
          if (similar < vMaxH[0]._4_4_) {
            similar = vMaxH[0]._4_4_;
            length = vMaxM[0]._4_4_;
            vNegLimit[1]._4_4_ = vMaxS[0]._4_4_;
            vNegLimit[1]._0_4_ = vMaxL[0]._4_4_;
          }
          vMaxH[0] = vMaxH[0] << 0x20 | (ulong)vMaxM[1] >> 0x20;
          vMaxM[1] = vMaxM[1] << 0x20;
          vMaxM[0] = vMaxM[0] << 0x20 | (ulong)vMaxS[1] >> 0x20;
          vMaxS[1] = vMaxS[1] << 0x20;
          vMaxS[0] = vMaxS[0] << 0x20 | (ulong)vMaxL[1] >> 0x20;
          vMaxL[1] = vMaxL[1] << 0x20;
          vMaxL[0] = vMaxL[0] << 0x20 | (ulong)vILimit[1] >> 0x20;
          vILimit[1] = vILimit[1] << 0x20;
        }
        local_28 = (int)vSaturationCheckMax[1];
        iStack_24 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
        iStack_20 = (int)vSaturationCheckMin[0];
        iStack_1c = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
        local_748 = (int)vNegInf[1];
        iStack_744 = (int)((ulong)vNegInf[1] >> 0x20);
        iStack_740 = (int)vSaturationCheckMax[0];
        iStack_73c = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
        uVar59 = CONCAT44(-(uint)(iStack_1c < (int)uVar51),-(uint)(iStack_20 < (int)uVar51)) |
                 CONCAT44(-(uint)(iVar52 < iStack_73c),-(uint)(iVar52 < iStack_740));
        auVar48._8_8_ = uVar59;
        auVar48._0_8_ =
             CONCAT44(-(uint)(iStack_24 < (int)uVar51),-(uint)(local_28 < (int)uVar51)) |
             CONCAT44(-(uint)(iVar52 < iStack_744),-(uint)(iVar52 < local_748));
        if ((((((((((((((((auVar48 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar48 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar48 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar48 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar48 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar48 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar59 >> 7 & 1) != 0) || (uVar59 >> 0xf & 1) != 0) || (uVar59 >> 0x17 & 1) != 0)
               || (uVar59 >> 0x1f & 1) != 0) || (uVar59 >> 0x27 & 1) != 0) ||
             (uVar59 >> 0x2f & 1) != 0) || (uVar59 >> 0x37 & 1) != 0) || (long)uVar59 < 0) {
          ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x40;
          similar = 0;
          length = 0;
          vNegLimit[1]._4_4_ = 0;
          vNegLimit[1]._0_4_ = 0;
          NEG_LIMIT = 0;
          POS_LIMIT = 0;
        }
        ((parasail_result_t *)_s1_local)->score = similar;
        ((parasail_result_t *)_s1_local)->end_query = NEG_LIMIT;
        ((parasail_result_t *)_s1_local)->end_ref = POS_LIMIT;
        ((((parasail_result_t *)_s1_local)->field_4).stats)->matches = length;
        ((((parasail_result_t *)_s1_local)->field_4).stats)->similar = vNegLimit[1]._4_4_;
        ((((parasail_result_t *)_s1_local)->field_4).stats)->length = (uint)vNegLimit[1];
        parasail_free(ptr_08);
        parasail_free(ptr_07);
        parasail_free(ptr_06);
        parasail_free(ptr_05);
        parasail_free(ptr_04);
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
      }
    }
  }
  return (parasail_result_t *)_s1_local;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _HM_pr = NULL;
    int32_t * restrict _HS_pr = NULL;
    int32_t * restrict _HL_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict _FM_pr = NULL;
    int32_t * restrict _FS_pr = NULL;
    int32_t * restrict _FL_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict HM_pr = NULL;
    int32_t * restrict HS_pr = NULL;
    int32_t * restrict HL_pr = NULL;
    int32_t * restrict F_pr = NULL;
    int32_t * restrict FM_pr = NULL;
    int32_t * restrict FS_pr = NULL;
    int32_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vNegInf0;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vZero = _mm_set1_epi32(0);
    vNegInf0 = _mm_insert_epi32(vZero, NEG_LIMIT, 3);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vGapN = _mm_set1_epi32(gap*N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vILimit1 = _mm_sub_epi32(vILimit, vOne);
    vJLimit = _mm_set1_epi32(s2Len);
    vJLimit1 = _mm_sub_epi32(vJLimit, vOne);
    vIBoundary = _mm_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int32_t(16, s1Len+PAD);
    s2B    = parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr  = parasail_memalign_int32_t(16, s2Len+PAD2);
    _HM_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _HS_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _HL_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr  = parasail_memalign_int32_t(16, s2Len+PAD2);
    _FM_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _FS_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _FL_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i case1 = vZero;
        __m128i case2 = vZero;
        __m128i vNH = vZero;
        __m128i vNM = vZero;
        __m128i vNS = vZero;
        __m128i vNL = vZero;
        __m128i vWH = vZero;
        __m128i vWM = vZero;
        __m128i vWS = vZero;
        __m128i vWL = vZero;
        __m128i vE = vNegInf0;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vEM = vZero;
        __m128i vES = vZero;
        __m128i vEL = vZero;
        __m128i vF = vNegInf0;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vFM = vZero;
        __m128i vFS = vZero;
        __m128i vFL = vZero;
        __m128i vJ = vJreset;
        __m128i vs1 = _mm_set_epi32(
                s1[i+0],
                s1[i+1],
                s1[i+2],
                s1[i+3]);
        __m128i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        vNH = _mm_insert_epi32(vNH, H_pr[-1], 3);
        vWH = _mm_insert_epi32(vWH, -open - i*gap, 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            __m128i vNWM = vNM;
            __m128i vNWS = vNS;
            __m128i vNWL = vNL;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32(vNH, H_pr[j], 3);
            vNM = _mm_srli_si128(vWM, 4);
            vNM = _mm_insert_epi32(vNM, HM_pr[j], 3);
            vNS = _mm_srli_si128(vWS, 4);
            vNS = _mm_insert_epi32(vNS, HS_pr[j], 3);
            vNL = _mm_srli_si128(vWL, 4);
            vNL = _mm_insert_epi32(vNL, HL_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, F_pr[j], 3);
            vFM = _mm_srli_si128(vFM, 4);
            vFM = _mm_insert_epi32(vFM, FM_pr[j], 3);
            vFS = _mm_srli_si128(vFS, 4);
            vFS = _mm_insert_epi32(vFS, FS_pr[j], 3);
            vFL = _mm_srli_si128(vFL, 4);
            vFL = _mm_insert_epi32(vFL, FL_pr[j], 3);
            vF_opn = _mm_sub_epi32(vNH, vOpen);
            vF_ext = _mm_sub_epi32(vF, vGap);
            vF = _mm_max_epi32(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi32(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vNM, case1);
            vFS = _mm_blendv_epi8(vFS, vNS, case1);
            vFL = _mm_blendv_epi8(vFL, vNL, case1);
            vFL = _mm_add_epi32(vFL, vOne);
            vE_opn = _mm_sub_epi32(vWH, vOpen);
            vE_ext = _mm_sub_epi32(vE, vGap);
            vE = _mm_max_epi32(vE_opn, vE_ext);
            case1 = _mm_cmpgt_epi32(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vWM, case1);
            vES = _mm_blendv_epi8(vES, vWS, case1);
            vEL = _mm_blendv_epi8(vEL, vWL, case1);
            vEL = _mm_add_epi32(vEL, vOne);
            vs2 = _mm_srli_si128(vs2, 4);
            vs2 = _mm_insert_epi32(vs2, s2[j], 3);
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32(vNWH, vE);
            vWH = _mm_max_epi32(vWH, vF);
            case1 = _mm_cmpeq_epi32(vWH, vNWH);
            case2 = _mm_cmpeq_epi32(vWH, vF);
            vWM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi32(vNWM,
                        _mm_and_si128(
                            _mm_cmpeq_epi32(vs1,vs2),
                            vOne)),
                    case1);
            vWS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi32(vNWS,
                        _mm_and_si128(
                            _mm_cmpgt_epi32(vMat,vZero),
                            vOne)),
                    case1);
            vWL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi32(vNWL, vOne), case1);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vWM = _mm_andnot_si128(cond, vWM);
                vWS = _mm_andnot_si128(cond, vWS);
                vWL = _mm_andnot_si128(cond, vWL);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm_andnot_si128(cond, vEM);
                vES = _mm_andnot_si128(cond, vES);
                vEL = _mm_andnot_si128(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWL);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32(vWH,0);
            HM_pr[j-3] = (int32_t)_mm_extract_epi32(vWM,0);
            HS_pr[j-3] = (int32_t)_mm_extract_epi32(vWS,0);
            HL_pr[j-3] = (int32_t)_mm_extract_epi32(vWL,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32(vF,0);
            FM_pr[j-3] = (int32_t)_mm_extract_epi32(vFM,0);
            FS_pr[j-3] = (int32_t)_mm_extract_epi32(vFS,0);
            FL_pr[j-3] = (int32_t)_mm_extract_epi32(vFL,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi32(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi32(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vMaxM = _mm_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8(vMaxL, vWL, cond_all);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
        vIBoundary = _mm_sub_epi32(vIBoundary, vGapN);
    }

    /* max in vMaxH */
    for (i=0; i<N; ++i) {
        int32_t value;
        value = (int32_t) _mm_extract_epi32(vMaxH, 3);
        if (value > score) {
            score = value;
            matches = (int32_t) _mm_extract_epi32(vMaxM, 3);
            similar = (int32_t) _mm_extract_epi32(vMaxS, 3);
            length= (int32_t) _mm_extract_epi32(vMaxL, 3);
        }
        vMaxH = _mm_slli_si128(vMaxH, 4);
        vMaxM = _mm_slli_si128(vMaxM, 4);
        vMaxS = _mm_slli_si128(vMaxS, 4);
        vMaxL = _mm_slli_si128(vMaxL, 4);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}